

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O0

void __thiscall ASectorAction::Destroy(ASectorAction *this)

{
  AActor *pAVar1;
  AActor **local_20;
  anon_union_8_2_f4a84a0e prev;
  AActor *probe;
  ASectorAction *this_local;
  
  if ((this->super_AActor).Sector != (sector_t *)0x0) {
    prev.act = (AActor **)
               ::TObjPtr::operator_cast_to_ASectorAction_
                         ((TObjPtr *)&((this->super_AActor).Sector)->SecActTarget);
    local_20 = (AActor **)
               TObjPtr<ASectorAction>::operator&(&((this->super_AActor).Sector)->SecActTarget);
    for (; prev.act != (AActor **)0x0 && (ASectorAction *)prev.act != this;
        prev.act = (AActor **)::TObjPtr::operator_cast_to_AActor_((TObjPtr *)(prev.act + 0x4f))) {
      local_20 = TObjPtr<AActor>::operator&((TObjPtr<AActor> *)(prev.act + 0x4f));
    }
    if (prev.act != (AActor **)0x0) {
      pAVar1 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)(prev.act + 0x4f));
      *local_20 = pAVar1;
    }
    (this->super_AActor).Sector = (sector_t *)0x0;
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ASectorAction::Destroy ()
{
	if (Sector != nullptr)
	{
		// Remove ourself from this sector's list of actions
		AActor *probe = Sector->SecActTarget;
		union
		{
			AActor **act;
			ASectorAction **secact;
		} prev;
		prev.secact = &Sector->SecActTarget;

		while (probe && probe != this)
		{
			prev.act = &probe->tracer;
			probe = probe->tracer;
		}
		if (probe != nullptr)
		{
			*prev.act = probe->tracer;
		}
		Sector = nullptr;
	}

	Super::Destroy ();
}